

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::patchScope(Poppifier *this,Expression **expr)

{
  reference pvVar1;
  size_type sVar2;
  reference ppEVar3;
  Block *pBVar4;
  optional<wasm::Type> type;
  undefined1 local_68 [2] [12];
  Block *local_48;
  Block *block;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  type scope;
  Expression **expr_local;
  Poppifier *this_local;
  
  scope.instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = expr;
  pvVar1 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  Scope::Scope((Scope *)&instrs,pvVar1);
  block = (Block *)&scope;
  std::
  vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
  ::pop_back(&this->scopeStack);
  local_48 = Expression::dynCast<wasm::Block>
                       (*scope.instrs.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pBVar4 = block;
  if (local_48 == (Block *)0x0) {
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)local_68,
               &(*scope.instrs.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->type);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_68[0]._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_68[0][8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_68[0]._9_3_;
    pBVar4 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)pBVar4,
                        type);
    *scope.instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage = (Expression *)pBVar4;
  }
  else {
    sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)block);
    if ((sVar2 == 0) ||
       (ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             block,0), (Block *)*ppEVar3 != local_48)) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
                 &local_48->list,
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)block);
    }
  }
  Scope::~Scope((Scope *)&instrs);
  return;
}

Assistant:

void Poppifier::patchScope(Expression*& expr) {
  auto scope = std::move(scopeStack.back());
  auto& instrs = scope.instrs;
  scopeStack.pop_back();
  if (auto* block = expr->dynCast<Block>()) {
    // Reuse blocks, but do not patch a block into itself, which would otherwise
    // happen when emitting if/else or try/catch arms and function bodies.
    if (instrs.size() == 0 || instrs[0] != block) {
      block->list.set(instrs);
    }
  } else {
    // Otherwise create a new block, even if we have just a single
    // expression. We want blocks in every new scope rather than other
    // instructions because Poppy IR optimizations only look at the children of
    // blocks.
    expr = builder.makeBlock(instrs, expr->type);
  }
}